

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void sqlite3DeleteFrom(Parse *pParse,SrcList *pTabList,Expr *pWhere,ExprList *pOrderBy,Expr *pLimit)

{
  sqlite3 *db_00;
  long lVar1;
  Table *p;
  int iVar2;
  int iVar3;
  Trigger *pTrigger_00;
  char *zP4;
  VTable *zP4_00;
  ushort uVar4;
  bool bVar5;
  int local_164;
  int local_14c;
  bool local_135;
  int count;
  char *pVTab;
  int iAddrOnce;
  u16 wcf;
  Trigger *pTrigger;
  uint local_110;
  int isView;
  int bComplex;
  int addrEphOpen;
  int addrLoop;
  int addrBypass;
  int iRowSet;
  int iEphCur;
  i16 nKey;
  int iKey;
  i16 nPk;
  Index *pIStack_e8;
  int iPk;
  Index *pPk;
  u8 *aToOpen;
  int aiCurOnePass [2];
  int eOnePass;
  int rcauth;
  int memCnt;
  int iDb;
  NameContext sNC;
  AuthContext sContext;
  sqlite3 *db;
  int nIdx;
  int iIdxCur;
  int iDataCur;
  int iTabCur;
  Index *pIdx;
  WhereInfo *pWInfo;
  Table *pTStack_48;
  int i;
  Table *pTab;
  Vdbe *v;
  Expr *pLimit_local;
  ExprList *pOrderBy_local;
  Expr *pWhere_local;
  SrcList *pTabList_local;
  Parse *pParse_local;
  
  nIdx = 0;
  db._4_4_ = 0;
  eOnePass = 0;
  pPk = (Index *)0x0;
  iKey = 0;
  nKey = 1;
  addrBypass = 0;
  addrLoop = 0;
  addrEphOpen = 0;
  bComplex = 0;
  isView = 0;
  v = (Vdbe *)pLimit;
  pLimit_local = (Expr *)pOrderBy;
  pOrderBy_local = (ExprList *)pWhere;
  pWhere_local = (Expr *)pTabList;
  pTabList_local = (SrcList *)pParse;
  memset(&sNC.pWinSelect,0,0x10);
  db_00 = *(sqlite3 **)pTabList_local;
  if ((*(int *)&pTabList_local->a[0].pSelect == 0) &&
     (pTStack_48 = sqlite3SrcListLookup((Parse *)pTabList_local,(SrcList *)pWhere_local),
     pTStack_48 != (Table *)0x0)) {
    pTrigger_00 = sqlite3TriggersExist
                            ((Parse *)pTabList_local,pTStack_48,0x80,(ExprList *)0x0,(int *)0x0);
    bVar5 = pTStack_48->eTabType == '\x02';
    local_135 = true;
    if (pTrigger_00 == (Trigger *)0x0) {
      iVar2 = sqlite3FkRequired((Parse *)pTabList_local,pTStack_48,(int *)0x0,0);
      local_135 = iVar2 != 0;
    }
    local_110 = (uint)local_135;
    iVar2 = sqlite3ViewGetColumnNames((Parse *)pTabList_local,pTStack_48);
    if ((iVar2 == 0) &&
       (iVar2 = sqlite3IsReadOnly((Parse *)pTabList_local,pTStack_48,pTrigger_00), iVar2 == 0)) {
      iVar2 = sqlite3SchemaToIndex(db_00,pTStack_48->pSchema);
      aiCurOnePass[1] =
           sqlite3AuthCheck((Parse *)pTabList_local,9,pTStack_48->zName,(char *)0x0,
                            db_00->aDb[iVar2].zDbSName);
      if (aiCurOnePass[1] != 1) {
        iIdxCur = *(int *)((long)&pTabList_local->a[0].pSelect + 4);
        *(int *)((long)&pTabList_local->a[0].pSelect + 4) = iIdxCur + 1;
        pWhere_local[1].op = (char)iIdxCur;
        pWhere_local[1].affExpr = (char)((uint)iIdxCur >> 8);
        pWhere_local[1].op2 = (char)((uint)iIdxCur >> 0x10);
        pWhere_local[1].field_0x3 = (char)((uint)iIdxCur >> 0x18);
        db._0_4_ = 0;
        for (_iDataCur = pTStack_48->pIndex; _iDataCur != (Index *)0x0; _iDataCur = _iDataCur->pNext
            ) {
          *(int *)((long)&pTabList_local->a[0].pSelect + 4) =
               *(int *)((long)&pTabList_local->a[0].pSelect + 4) + 1;
          db._0_4_ = (int)db + 1;
        }
        if (bVar5) {
          sqlite3AuthContextPush
                    ((Parse *)pTabList_local,(AuthContext *)&sNC.pWinSelect,pTStack_48->zName);
        }
        pTab = (Table *)sqlite3GetVdbe((Parse *)pTabList_local);
        if ((Vdbe *)pTab != (Vdbe *)0x0) {
          if (*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0') {
            sqlite3VdbeCountChanges((Vdbe *)pTab);
          }
          sqlite3BeginWriteOperation((Parse *)pTabList_local,local_110,iVar2);
          if (bVar5) {
            sqlite3MaterializeView
                      ((Parse *)pTabList_local,pTStack_48,(Expr *)pOrderBy_local,
                       (ExprList *)pLimit_local,(Expr *)v,iIdxCur);
            db._4_4_ = iIdxCur;
            nIdx = iIdxCur;
            pLimit_local = (Expr *)0x0;
            v = (Vdbe *)0x0;
          }
          memset(&memCnt,0,0x38);
          _memCnt = (Parse *)pTabList_local;
          sNC.pParse = (Parse *)pWhere_local;
          iVar3 = sqlite3ResolveExprNames((NameContext *)&memCnt,(Expr *)pOrderBy_local);
          if (iVar3 == 0) {
            if (((((db_00->flags & 0x100000000) != 0) &&
                 (*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0')) &&
                (*(long *)&pTabList_local[1].a[0].iCursor == 0)) &&
               (*(char *)((long)&pTabList_local[2].nSrc + 3) == '\0')) {
              eOnePass = pTabList_local->a[0].addrFillSub + 1;
              pTabList_local->a[0].addrFillSub = eOnePass;
              sqlite3VdbeAddOp2((Vdbe *)pTab,0x47,0,eOnePass);
            }
            if (((aiCurOnePass[1] == 0) && (pOrderBy_local == (ExprList *)0x0)) &&
               ((local_110 == 0 && (pTStack_48->eTabType != '\x01')))) {
              sqlite3TableLock((Parse *)pTabList_local,iVar2,pTStack_48->tnum,'\x01',
                               pTStack_48->zName);
              if ((pTStack_48->tabFlags & 0x80) == 0) {
                if (eOnePass == 0) {
                  local_14c = -1;
                }
                else {
                  local_14c = eOnePass;
                }
                sqlite3VdbeAddOp4((Vdbe *)pTab,0x91,pTStack_48->tnum,iVar2,local_14c,
                                  pTStack_48->zName,-1);
              }
              for (_iDataCur = pTStack_48->pIndex; _iDataCur != (Index *)0x0;
                  _iDataCur = _iDataCur->pNext) {
                if (((*(ushort *)&_iDataCur->field_0x63 & 3) == 2) &&
                   ((pTStack_48->tabFlags & 0x80) != 0)) {
                  if (eOnePass == 0) {
                    local_164 = -1;
                  }
                  else {
                    local_164 = eOnePass;
                  }
                  sqlite3VdbeAddOp3((Vdbe *)pTab,0x91,_iDataCur->tnum,iVar2,local_164);
                }
                else {
                  sqlite3VdbeAddOp2((Vdbe *)pTab,0x91,_iDataCur->tnum,iVar2);
                }
              }
            }
            else {
              if ((sNC.nRef & 0x40U) != 0) {
                local_110 = 1;
              }
              uVar4 = 8;
              if (local_110 != 0) {
                uVar4 = 0;
              }
              if ((pTStack_48->tabFlags & 0x80) == 0) {
                pIStack_e8 = (Index *)0x0;
                addrLoop = pTabList_local->a[0].addrFillSub + 1;
                pTabList_local->a[0].addrFillSub = addrLoop;
                sqlite3VdbeAddOp2((Vdbe *)pTab,0x4b,0,addrLoop);
              }
              else {
                pIStack_e8 = sqlite3PrimaryKeyIndex(pTStack_48);
                nKey = pIStack_e8->nKeyCol;
                iKey = pTabList_local->a[0].addrFillSub + 1;
                pTabList_local->a[0].addrFillSub = (int)nKey + pTabList_local->a[0].addrFillSub;
                addrBypass = *(int *)((long)&pTabList_local->a[0].pSelect + 4);
                *(int *)((long)&pTabList_local->a[0].pSelect + 4) = addrBypass + 1;
                isView = sqlite3VdbeAddOp2((Vdbe *)pTab,0x76,addrBypass,(int)nKey);
                sqlite3VdbeSetP4KeyInfo((Parse *)pTabList_local,pIStack_e8);
              }
              pIdx = (Index *)sqlite3WhereBegin((Parse *)pTabList_local,(SrcList *)pWhere_local,
                                                (Expr *)pOrderBy_local,(ExprList *)0x0,
                                                (ExprList *)0x0,(Select *)0x0,uVar4 | 0x14,
                                                iIdxCur + 1);
              if ((WhereInfo *)pIdx == (WhereInfo *)0x0) goto LAB_00186e42;
              aiCurOnePass[0] = sqlite3WhereOkOnePass((WhereInfo *)pIdx,(int *)&aToOpen);
              if (aiCurOnePass[0] != 1) {
                sqlite3MultiWrite((Parse *)pTabList_local);
              }
              iVar2 = sqlite3WhereUsesDeferredSeek((WhereInfo *)pIdx);
              if (iVar2 != 0) {
                sqlite3VdbeAddOp1((Vdbe *)pTab,0x8f,iIdxCur);
              }
              if (eOnePass != 0) {
                sqlite3VdbeAddOp2((Vdbe *)pTab,0x56,eOnePass,1);
              }
              if (pIStack_e8 == (Index *)0x0) {
                iEphCur = pTabList_local->a[0].addrFillSub + 1;
                pTabList_local->a[0].addrFillSub = iEphCur;
                sqlite3ExprCodeGetColumnOfTable((Vdbe *)pTab,pTStack_48,iIdxCur,-1,iEphCur);
              }
              else {
                for (pWInfo._4_4_ = 0; pWInfo._4_4_ < nKey; pWInfo._4_4_ = pWInfo._4_4_ + 1) {
                  sqlite3ExprCodeGetColumnOfTable
                            ((Vdbe *)pTab,pTStack_48,iIdxCur,(int)pIStack_e8->aiColumn[pWInfo._4_4_]
                             ,iKey + pWInfo._4_4_);
                }
                iEphCur = iKey;
              }
              p = pTab;
              if (aiCurOnePass[0] == 0) {
                if (pIStack_e8 == (Index *)0x0) {
                  sqlite3VdbeAddOp2((Vdbe *)pTab,0x9c,addrLoop,iEphCur);
                }
                else {
                  iEphCur = pTabList_local->a[0].addrFillSub + 1;
                  pTabList_local->a[0].addrFillSub = iEphCur;
                  zP4 = sqlite3IndexAffinityStr(*(sqlite3 **)pTabList_local,pIStack_e8);
                  sqlite3VdbeAddOp4((Vdbe *)p,0x61,iKey,(int)nKey,iEphCur,zP4,(int)nKey);
                  sqlite3VdbeAddOp4Int((Vdbe *)pTab,0x8a,addrBypass,iEphCur,iKey,(int)nKey);
                }
                iRowSet._2_2_ = (ushort)(pIStack_e8 == (Index *)0x0);
                sqlite3WhereEnd((WhereInfo *)pIdx);
              }
              else {
                iRowSet._2_2_ = nKey;
                pPk = (Index *)sqlite3DbMallocRawNN(db_00,(long)((int)db + 2));
                if (pPk == (Index *)0x0) {
                  sqlite3WhereEnd((WhereInfo *)pIdx);
                  goto LAB_00186e42;
                }
                memset(pPk,1,(long)((int)db + 1));
                *(undefined1 *)((long)&pPk->zName + (long)((int)db + 1)) = 0;
                if (-1 < (int)aToOpen) {
                  *(undefined1 *)((long)&pPk->zName + (long)((int)aToOpen - iIdxCur)) = 0;
                }
                if (-1 < aToOpen._4_4_) {
                  *(undefined1 *)((long)&pPk->zName + (long)(aToOpen._4_4_ - iIdxCur)) = 0;
                }
                if (isView != 0) {
                  sqlite3VdbeChangeToNoop((Vdbe *)pTab,isView);
                }
                addrEphOpen = sqlite3VdbeMakeLabel((Parse *)pTabList_local);
              }
              if (!bVar5) {
                pVTab._0_4_ = 0;
                if (aiCurOnePass[0] == 2) {
                  pVTab._0_4_ = sqlite3VdbeAddOp0((Vdbe *)pTab,0xf);
                }
                sqlite3OpenTableAndIndices
                          ((Parse *)pTabList_local,pTStack_48,0x71,'\b',iIdxCur,(u8 *)pPk,&nIdx,
                           (int *)((long)&db + 4));
                if (aiCurOnePass[0] == 2) {
                  sqlite3VdbeJumpHereOrPopInst((Vdbe *)pTab,(int)pVTab);
                }
              }
              if (aiCurOnePass[0] == 0) {
                if (pIStack_e8 == (Index *)0x0) {
                  bComplex = sqlite3VdbeAddOp3((Vdbe *)pTab,0x2e,addrLoop,0,iEphCur);
                }
                else {
                  bComplex = sqlite3VdbeAddOp1((Vdbe *)pTab,0x24,addrBypass);
                  if (pTStack_48->eTabType == '\x01') {
                    sqlite3VdbeAddOp3((Vdbe *)pTab,0x5e,addrBypass,0,iEphCur);
                  }
                  else {
                    sqlite3VdbeAddOp2((Vdbe *)pTab,0x86,addrBypass,iEphCur);
                  }
                }
              }
              else if ((pTStack_48->eTabType != '\x01') &&
                      (*(char *)((long)&pPk->zName + (long)(nIdx - iIdxCur)) != '\0')) {
                sqlite3VdbeAddOp4Int
                          ((Vdbe *)pTab,0x1c,nIdx,addrEphOpen,iEphCur,(int)(short)iRowSet._2_2_);
              }
              if (pTStack_48->eTabType == '\x01') {
                zP4_00 = sqlite3GetVTable(db_00,pTStack_48);
                sqlite3VtabMakeWritable((Parse *)pTabList_local,pTStack_48);
                sqlite3MayAbort((Parse *)pTabList_local);
                if ((aiCurOnePass[0] == 1) &&
                   (sqlite3VdbeAddOp1((Vdbe *)pTab,0x7a,iIdxCur),
                   lVar1._0_4_ = pTabList_local[1].a[0].regResult,
                   lVar1._4_4_ = pTabList_local[1].a[0].fg, lVar1 == 0)) {
                  *(undefined1 *)&pTabList_local->a[0].zAlias = 0;
                }
                sqlite3VdbeAddOp4((Vdbe *)pTab,7,0,1,iEphCur,(char *)zP4_00,-0xb);
                sqlite3VdbeChangeP5((Vdbe *)pTab,2);
              }
              else {
                sqlite3GenerateRowDelete
                          ((Parse *)pTabList_local,pTStack_48,pTrigger_00,nIdx,db._4_4_,iEphCur,
                           iRowSet._2_2_,*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0',
                           '\v',(u8)aiCurOnePass[0],aToOpen._4_4_);
              }
              if (aiCurOnePass[0] == 0) {
                if (pIStack_e8 == (Index *)0x0) {
                  sqlite3VdbeGoto((Vdbe *)pTab,bComplex);
                  sqlite3VdbeJumpHere((Vdbe *)pTab,bComplex);
                }
                else {
                  sqlite3VdbeAddOp2((Vdbe *)pTab,0x27,addrBypass,bComplex + 1);
                  sqlite3VdbeJumpHere((Vdbe *)pTab,bComplex);
                }
              }
              else {
                sqlite3VdbeResolveLabel((Vdbe *)pTab,addrEphOpen);
                sqlite3WhereEnd((WhereInfo *)pIdx);
              }
            }
            if ((*(char *)((long)&pTabList_local->a[0].zName + 6) == '\0') &&
               (*(long *)&pTabList_local[1].a[0].iCursor == 0)) {
              sqlite3AutoincrementEnd((Parse *)pTabList_local);
            }
            if (eOnePass != 0) {
              sqlite3CodeChangeCount((Vdbe *)pTab,eOnePass,"rows deleted");
            }
          }
        }
      }
    }
  }
LAB_00186e42:
  sqlite3AuthContextPop((AuthContext *)&sNC.pWinSelect);
  sqlite3SrcListDelete(db_00,(SrcList *)pWhere_local);
  sqlite3ExprDelete(db_00,(Expr *)pOrderBy_local);
  if (pPk != (Index *)0x0) {
    sqlite3DbNNFreeNN(db_00,pPk);
  }
  return;
}

Assistant:

SQLITE_PRIVATE void sqlite3DeleteFrom(
  Parse *pParse,         /* The parser context */
  SrcList *pTabList,     /* The table from which we should delete things */
  Expr *pWhere,          /* The WHERE clause.  May be null */
  ExprList *pOrderBy,    /* ORDER BY clause. May be null */
  Expr *pLimit           /* LIMIT clause. May be null */
){
  Vdbe *v;               /* The virtual database engine */
  Table *pTab;           /* The table from which records will be deleted */
  int i;                 /* Loop counter */
  WhereInfo *pWInfo;     /* Information about the WHERE clause */
  Index *pIdx;           /* For looping over indices of the table */
  int iTabCur;           /* Cursor number for the table */
  int iDataCur = 0;      /* VDBE cursor for the canonical data source */
  int iIdxCur = 0;       /* Cursor number of the first index */
  int nIdx;              /* Number of indices */
  sqlite3 *db;           /* Main database structure */
  AuthContext sContext;  /* Authorization context */
  NameContext sNC;       /* Name context to resolve expressions in */
  int iDb;               /* Database number */
  int memCnt = 0;        /* Memory cell used for change counting */
  int rcauth;            /* Value returned by authorization callback */
  int eOnePass;          /* ONEPASS_OFF or _SINGLE or _MULTI */
  int aiCurOnePass[2];   /* The write cursors opened by WHERE_ONEPASS */
  u8 *aToOpen = 0;       /* Open cursor iTabCur+j if aToOpen[j] is true */
  Index *pPk;            /* The PRIMARY KEY index on the table */
  int iPk = 0;           /* First of nPk registers holding PRIMARY KEY value */
  i16 nPk = 1;           /* Number of columns in the PRIMARY KEY */
  int iKey;              /* Memory cell holding key of row to be deleted */
  i16 nKey;              /* Number of memory cells in the row key */
  int iEphCur = 0;       /* Ephemeral table holding all primary key values */
  int iRowSet = 0;       /* Register for rowset of rows to delete */
  int addrBypass = 0;    /* Address of jump over the delete logic */
  int addrLoop = 0;      /* Top of the delete loop */
  int addrEphOpen = 0;   /* Instruction to open the Ephemeral table */
  int bComplex;          /* True if there are triggers or FKs or
                         ** subqueries in the WHERE clause */

#ifndef SQLITE_OMIT_TRIGGER
  int isView;                  /* True if attempting to delete from a view */
  Trigger *pTrigger;           /* List of table triggers, if required */
#endif

  memset(&sContext, 0, sizeof(sContext));
  db = pParse->db;
  assert( db->pParse==pParse );
  if( pParse->nErr ){
    goto delete_from_cleanup;
  }
  assert( db->mallocFailed==0 );
  assert( pTabList->nSrc==1 );

  /* Locate the table which we want to delete.  This table has to be
  ** put in an SrcList structure because some of the subroutines we
  ** will be calling are designed to work with multiple tables and expect
  ** an SrcList* parameter instead of just a Table* parameter.
  */
  pTab = sqlite3SrcListLookup(pParse, pTabList);
  if( pTab==0 )  goto delete_from_cleanup;

  /* Figure out if we have any triggers and if the table being
  ** deleted from is a view
  */
#ifndef SQLITE_OMIT_TRIGGER
  pTrigger = sqlite3TriggersExist(pParse, pTab, TK_DELETE, 0, 0);
  isView = IsView(pTab);
#else
# define pTrigger 0
# define isView 0
#endif
  bComplex = pTrigger || sqlite3FkRequired(pParse, pTab, 0, 0);
#ifdef SQLITE_OMIT_VIEW
# undef isView
# define isView 0
#endif

#if TREETRACE_ENABLED
  if( sqlite3TreeTrace & 0x10000 ){
    sqlite3TreeViewLine(0, "In sqlite3Delete() at %s:%d", __FILE__, __LINE__);
    sqlite3TreeViewDelete(pParse->pWith, pTabList, pWhere,
                          pOrderBy, pLimit, pTrigger);
  }
#endif

#ifdef SQLITE_ENABLE_UPDATE_DELETE_LIMIT
  if( !isView ){
    pWhere = sqlite3LimitWhere(
        pParse, pTabList, pWhere, pOrderBy, pLimit, "DELETE"
    );
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* If pTab is really a view, make sure it has been initialized.
  */
  if( sqlite3ViewGetColumnNames(pParse, pTab) ){
    goto delete_from_cleanup;
  }

  if( sqlite3IsReadOnly(pParse, pTab, pTrigger) ){
    goto delete_from_cleanup;
  }
  iDb = sqlite3SchemaToIndex(db, pTab->pSchema);
  assert( iDb<db->nDb );
  rcauth = sqlite3AuthCheck(pParse, SQLITE_DELETE, pTab->zName, 0,
                            db->aDb[iDb].zDbSName);
  assert( rcauth==SQLITE_OK || rcauth==SQLITE_DENY || rcauth==SQLITE_IGNORE );
  if( rcauth==SQLITE_DENY ){
    goto delete_from_cleanup;
  }
  assert(!isView || pTrigger);

  /* Assign cursor numbers to the table and all its indices.
  */
  assert( pTabList->nSrc==1 );
  iTabCur = pTabList->a[0].iCursor = pParse->nTab++;
  for(nIdx=0, pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext, nIdx++){
    pParse->nTab++;
  }

  /* Start the view context
  */
  if( isView ){
    sqlite3AuthContextPush(pParse, &sContext, pTab->zName);
  }

  /* Begin generating code.
  */
  v = sqlite3GetVdbe(pParse);
  if( v==0 ){
    goto delete_from_cleanup;
  }
  if( pParse->nested==0 ) sqlite3VdbeCountChanges(v);
  sqlite3BeginWriteOperation(pParse, bComplex, iDb);

  /* If we are trying to delete from a view, realize that view into
  ** an ephemeral table.
  */
#if !defined(SQLITE_OMIT_VIEW) && !defined(SQLITE_OMIT_TRIGGER)
  if( isView ){
    sqlite3MaterializeView(pParse, pTab,
        pWhere, pOrderBy, pLimit, iTabCur
    );
    iDataCur = iIdxCur = iTabCur;
    pOrderBy = 0;
    pLimit = 0;
  }
#endif

  /* Resolve the column names in the WHERE clause.
  */
  memset(&sNC, 0, sizeof(sNC));
  sNC.pParse = pParse;
  sNC.pSrcList = pTabList;
  if( sqlite3ResolveExprNames(&sNC, pWhere) ){
    goto delete_from_cleanup;
  }

  /* Initialize the counter of the number of rows deleted, if
  ** we are counting rows.
  */
  if( (db->flags & SQLITE_CountRows)!=0
   && !pParse->nested
   && !pParse->pTriggerTab
   && !pParse->bReturning
  ){
    memCnt = ++pParse->nMem;
    sqlite3VdbeAddOp2(v, OP_Integer, 0, memCnt);
  }

#ifndef SQLITE_OMIT_TRUNCATE_OPTIMIZATION
  /* Special case: A DELETE without a WHERE clause deletes everything.
  ** It is easier just to erase the whole table. Prior to version 3.6.5,
  ** this optimization caused the row change count (the value returned by
  ** API function sqlite3_count_changes) to be set incorrectly.
  **
  ** The "rcauth==SQLITE_OK" terms is the
  ** IMPLEMENTATION-OF: R-17228-37124 If the action code is SQLITE_DELETE and
  ** the callback returns SQLITE_IGNORE then the DELETE operation proceeds but
  ** the truncate optimization is disabled and all rows are deleted
  ** individually.
  */
  if( rcauth==SQLITE_OK
   && pWhere==0
   && !bComplex
   && !IsVirtual(pTab)
#ifdef SQLITE_ENABLE_PREUPDATE_HOOK
   && db->xPreUpdateCallback==0
#endif
  ){
    assert( !isView );
    sqlite3TableLock(pParse, iDb, pTab->tnum, 1, pTab->zName);
    if( HasRowid(pTab) ){
      sqlite3VdbeAddOp4(v, OP_Clear, pTab->tnum, iDb, memCnt ? memCnt : -1,
                        pTab->zName, P4_STATIC);
    }
    for(pIdx=pTab->pIndex; pIdx; pIdx=pIdx->pNext){
      assert( pIdx->pSchema==pTab->pSchema );
      if( IsPrimaryKeyIndex(pIdx) && !HasRowid(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Clear, pIdx->tnum, iDb, memCnt ? memCnt : -1);
      }else{
        sqlite3VdbeAddOp2(v, OP_Clear, pIdx->tnum, iDb);
      }
    }
  }else
#endif /* SQLITE_OMIT_TRUNCATE_OPTIMIZATION */
  {
    u16 wcf = WHERE_ONEPASS_DESIRED|WHERE_DUPLICATES_OK;
    if( sNC.ncFlags & NC_Subquery ) bComplex = 1;
    wcf |= (bComplex ? 0 : WHERE_ONEPASS_MULTIROW);
    if( HasRowid(pTab) ){
      /* For a rowid table, initialize the RowSet to an empty set */
      pPk = 0;
      assert( nPk==1 );
      iRowSet = ++pParse->nMem;
      sqlite3VdbeAddOp2(v, OP_Null, 0, iRowSet);
    }else{
      /* For a WITHOUT ROWID table, create an ephemeral table used to
      ** hold all primary keys for rows to be deleted. */
      pPk = sqlite3PrimaryKeyIndex(pTab);
      assert( pPk!=0 );
      nPk = pPk->nKeyCol;
      iPk = pParse->nMem+1;
      pParse->nMem += nPk;
      iEphCur = pParse->nTab++;
      addrEphOpen = sqlite3VdbeAddOp2(v, OP_OpenEphemeral, iEphCur, nPk);
      sqlite3VdbeSetP4KeyInfo(pParse, pPk);
    }

    /* Construct a query to find the rowid or primary key for every row
    ** to be deleted, based on the WHERE clause. Set variable eOnePass
    ** to indicate the strategy used to implement this delete:
    **
    **  ONEPASS_OFF:    Two-pass approach - use a FIFO for rowids/PK values.
    **  ONEPASS_SINGLE: One-pass approach - at most one row deleted.
    **  ONEPASS_MULTI:  One-pass approach - any number of rows may be deleted.
    */
    pWInfo = sqlite3WhereBegin(pParse, pTabList, pWhere, 0, 0,0,wcf,iTabCur+1);
    if( pWInfo==0 ) goto delete_from_cleanup;
    eOnePass = sqlite3WhereOkOnePass(pWInfo, aiCurOnePass);
    assert( IsVirtual(pTab)==0 || eOnePass!=ONEPASS_MULTI );
    assert( IsVirtual(pTab) || bComplex || eOnePass!=ONEPASS_OFF
            || OptimizationDisabled(db, SQLITE_OnePass) );
    if( eOnePass!=ONEPASS_SINGLE ) sqlite3MultiWrite(pParse);
    if( sqlite3WhereUsesDeferredSeek(pWInfo) ){
      sqlite3VdbeAddOp1(v, OP_FinishSeek, iTabCur);
    }

    /* Keep track of the number of rows to be deleted */
    if( memCnt ){
      sqlite3VdbeAddOp2(v, OP_AddImm, memCnt, 1);
    }

    /* Extract the rowid or primary key for the current row */
    if( pPk ){
      for(i=0; i<nPk; i++){
        assert( pPk->aiColumn[i]>=0 );
        sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur,
                                        pPk->aiColumn[i], iPk+i);
      }
      iKey = iPk;
    }else{
      iKey = ++pParse->nMem;
      sqlite3ExprCodeGetColumnOfTable(v, pTab, iTabCur, -1, iKey);
    }

    if( eOnePass!=ONEPASS_OFF ){
      /* For ONEPASS, no need to store the rowid/primary-key. There is only
      ** one, so just keep it in its register(s) and fall through to the
      ** delete code.  */
      nKey = nPk; /* OP_Found will use an unpacked key */
      aToOpen = sqlite3DbMallocRawNN(db, nIdx+2);
      if( aToOpen==0 ){
        sqlite3WhereEnd(pWInfo);
        goto delete_from_cleanup;
      }
      memset(aToOpen, 1, nIdx+1);
      aToOpen[nIdx+1] = 0;
      if( aiCurOnePass[0]>=0 ) aToOpen[aiCurOnePass[0]-iTabCur] = 0;
      if( aiCurOnePass[1]>=0 ) aToOpen[aiCurOnePass[1]-iTabCur] = 0;
      if( addrEphOpen ) sqlite3VdbeChangeToNoop(v, addrEphOpen);
      addrBypass = sqlite3VdbeMakeLabel(pParse);
    }else{
      if( pPk ){
        /* Add the PK key for this row to the temporary table */
        iKey = ++pParse->nMem;
        nKey = 0;   /* Zero tells OP_Found to use a composite key */
        sqlite3VdbeAddOp4(v, OP_MakeRecord, iPk, nPk, iKey,
            sqlite3IndexAffinityStr(pParse->db, pPk), nPk);
        sqlite3VdbeAddOp4Int(v, OP_IdxInsert, iEphCur, iKey, iPk, nPk);
      }else{
        /* Add the rowid of the row to be deleted to the RowSet */
        nKey = 1;  /* OP_DeferredSeek always uses a single rowid */
        sqlite3VdbeAddOp2(v, OP_RowSetAdd, iRowSet, iKey);
      }
      sqlite3WhereEnd(pWInfo);
    }

    /* Unless this is a view, open cursors for the table we are
    ** deleting from and all its indices. If this is a view, then the
    ** only effect this statement has is to fire the INSTEAD OF
    ** triggers.
    */
    if( !isView ){
      int iAddrOnce = 0;
      if( eOnePass==ONEPASS_MULTI ){
        iAddrOnce = sqlite3VdbeAddOp0(v, OP_Once); VdbeCoverage(v);
      }
      testcase( IsVirtual(pTab) );
      sqlite3OpenTableAndIndices(pParse, pTab, OP_OpenWrite, OPFLAG_FORDELETE,
                                 iTabCur, aToOpen, &iDataCur, &iIdxCur);
      assert( pPk || IsVirtual(pTab) || iDataCur==iTabCur );
      assert( pPk || IsVirtual(pTab) || iIdxCur==iDataCur+1 );
      if( eOnePass==ONEPASS_MULTI ){
        sqlite3VdbeJumpHereOrPopInst(v, iAddrOnce);
      }
    }

    /* Set up a loop over the rowids/primary-keys that were found in the
    ** where-clause loop above.
    */
    if( eOnePass!=ONEPASS_OFF ){
      assert( nKey==nPk );  /* OP_Found will use an unpacked key */
      if( !IsVirtual(pTab) && aToOpen[iDataCur-iTabCur] ){
        assert( pPk!=0 || IsView(pTab) );
        sqlite3VdbeAddOp4Int(v, OP_NotFound, iDataCur, addrBypass, iKey, nKey);
        VdbeCoverage(v);
      }
    }else if( pPk ){
      addrLoop = sqlite3VdbeAddOp1(v, OP_Rewind, iEphCur); VdbeCoverage(v);
      if( IsVirtual(pTab) ){
        sqlite3VdbeAddOp3(v, OP_Column, iEphCur, 0, iKey);
      }else{
        sqlite3VdbeAddOp2(v, OP_RowData, iEphCur, iKey);
      }
      assert( nKey==0 );  /* OP_Found will use a composite key */
    }else{
      addrLoop = sqlite3VdbeAddOp3(v, OP_RowSetRead, iRowSet, 0, iKey);
      VdbeCoverage(v);
      assert( nKey==1 );
    }

    /* Delete the row */
#ifndef SQLITE_OMIT_VIRTUALTABLE
    if( IsVirtual(pTab) ){
      const char *pVTab = (const char *)sqlite3GetVTable(db, pTab);
      sqlite3VtabMakeWritable(pParse, pTab);
      assert( eOnePass==ONEPASS_OFF || eOnePass==ONEPASS_SINGLE );
      sqlite3MayAbort(pParse);
      if( eOnePass==ONEPASS_SINGLE ){
        sqlite3VdbeAddOp1(v, OP_Close, iTabCur);
        if( sqlite3IsToplevel(pParse) ){
          pParse->isMultiWrite = 0;
        }
      }
      sqlite3VdbeAddOp4(v, OP_VUpdate, 0, 1, iKey, pVTab, P4_VTAB);
      sqlite3VdbeChangeP5(v, OE_Abort);
    }else
#endif
    {
      int count = (pParse->nested==0);    /* True to count changes */
      sqlite3GenerateRowDelete(pParse, pTab, pTrigger, iDataCur, iIdxCur,
          iKey, nKey, count, OE_Default, eOnePass, aiCurOnePass[1]);
    }

    /* End of the loop over all rowids/primary-keys. */
    if( eOnePass!=ONEPASS_OFF ){
      sqlite3VdbeResolveLabel(v, addrBypass);
      sqlite3WhereEnd(pWInfo);
    }else if( pPk ){
      sqlite3VdbeAddOp2(v, OP_Next, iEphCur, addrLoop+1); VdbeCoverage(v);
      sqlite3VdbeJumpHere(v, addrLoop);
    }else{
      sqlite3VdbeGoto(v, addrLoop);
      sqlite3VdbeJumpHere(v, addrLoop);
    }
  } /* End non-truncate path */

  /* Update the sqlite_sequence table by storing the content of the
  ** maximum rowid counter values recorded while inserting into
  ** autoincrement tables.
  */
  if( pParse->nested==0 && pParse->pTriggerTab==0 ){
    sqlite3AutoincrementEnd(pParse);
  }

  /* Return the number of rows that were deleted. If this routine is
  ** generating code because of a call to sqlite3NestedParse(), do not
  ** invoke the callback function.
  */
  if( memCnt ){
    sqlite3CodeChangeCount(v, memCnt, "rows deleted");
  }

delete_from_cleanup:
  sqlite3AuthContextPop(&sContext);
  sqlite3SrcListDelete(db, pTabList);
  sqlite3ExprDelete(db, pWhere);
#if defined(SQLITE_ENABLE_UPDATE_DELETE_LIMIT)
  sqlite3ExprListDelete(db, pOrderBy);
  sqlite3ExprDelete(db, pLimit);
#endif
  if( aToOpen ) sqlite3DbNNFreeNN(db, aToOpen);
  return;
}